

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# que_remv_modi.cpp
# Opt level: O0

void __thiscall student::findRecord(student *this)

{
  undefined8 uVar1;
  bool bVar2;
  __type _Var3;
  ostream *poVar4;
  size_type sVar5;
  reference pvVar6;
  undefined1 local_1a8 [8];
  stu temp_2;
  size_t i_2;
  stu temp_1;
  size_t i_1;
  stu temp;
  size_t i;
  int local_8c;
  int flag;
  int num;
  string word;
  undefined1 local_68 [8];
  stu dis;
  char is;
  student *this_local;
  
  poVar4 = std::operator<<((ostream *)&std::cout,"----------------Find Record--------------------");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  bVar2 = std::queue<stu,_std::deque<stu,_std::allocator<stu>_>_>::empty(&this->students);
  if (bVar2) {
    poVar4 = std::operator<<((ostream *)&std::cout,"Sorry but there is empty");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::operator<<((ostream *)&std::cout,"Any key to continue");
    system("pause");
    return;
  }
  std::operator<<((ostream *)&std::cout,"Your want to search with(name->N, ID->I, ranking->R): ");
  std::operator>>((istream *)&std::cin,&dis.field_0x4f);
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  stu::stu((stu *)local_68);
  std::__cxx11::string::string((string *)&flag);
  bVar2 = true;
  if (dis._79_1_ == 'I') {
    std::operator<<((ostream *)&std::cout,"Your want to search: ");
    std::operator>>((istream *)&std::cin,(string *)&flag);
    temp_1.ranking = 0;
    temp_1._76_4_ = 0;
    for (; uVar1 = temp_1._72_8_,
        sVar5 = std::queue<stu,_std::deque<stu,_std::allocator<stu>_>_>::size(&this->students),
        (ulong)uVar1 < sVar5; temp_1._72_8_ = temp_1._72_8_ + 1) {
      pvVar6 = std::queue<stu,_std::deque<stu,_std::allocator<stu>_>_>::front(&this->students);
      stu::stu((stu *)&i_2,pvVar6);
      _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &temp_1.field_0x18,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &flag);
      if (_Var3) {
        stu::operator=((stu *)local_68,(stu *)&i_2);
        bVar2 = false;
      }
      std::queue<stu,_std::deque<stu,_std::allocator<stu>_>_>::pop(&this->students);
      std::queue<stu,_std::deque<stu,_std::allocator<stu>_>_>::push
                (&this->students,(value_type *)&i_2);
      stu::~stu((stu *)&i_2);
    }
  }
  else if (dis._79_1_ == 'N') {
    std::operator<<((ostream *)&std::cout,"Your want to search: ");
    std::operator>>((istream *)&std::cin,(string *)&flag);
    temp.ranking = 0;
    temp._76_4_ = 0;
    for (; uVar1 = temp._72_8_,
        sVar5 = std::queue<stu,_std::deque<stu,_std::allocator<stu>_>_>::size(&this->students),
        (ulong)uVar1 < sVar5; temp._72_8_ = temp._72_8_ + 1) {
      pvVar6 = std::queue<stu,_std::deque<stu,_std::allocator<stu>_>_>::front(&this->students);
      stu::stu((stu *)&i_1,pvVar6);
      _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &i_1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&flag);
      if (_Var3) {
        stu::operator=((stu *)local_68,(stu *)&i_1);
        bVar2 = false;
      }
      std::queue<stu,_std::deque<stu,_std::allocator<stu>_>_>::pop(&this->students);
      std::queue<stu,_std::deque<stu,_std::allocator<stu>_>_>::push
                (&this->students,(value_type *)&i_1);
      stu::~stu((stu *)&i_1);
    }
  }
  else {
    if (dis._79_1_ != 'R') {
      poVar4 = std::operator<<((ostream *)&std::cout,"Error");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      goto LAB_00107702;
    }
    std::operator<<((ostream *)&std::cout,"Your want to search: ");
    std::istream::operator>>((istream *)&std::cin,&local_8c);
    temp_2.ranking = 0;
    temp_2._76_4_ = 0;
    for (; uVar1 = temp_2._72_8_,
        sVar5 = std::queue<stu,_std::deque<stu,_std::allocator<stu>_>_>::size(&this->students),
        (ulong)uVar1 < sVar5; temp_2._72_8_ = temp_2._72_8_ + 1) {
      pvVar6 = std::queue<stu,_std::deque<stu,_std::allocator<stu>_>_>::front(&this->students);
      stu::stu((stu *)local_1a8,pvVar6);
      if (temp_2.class1 == local_8c) {
        stu::operator=((stu *)local_68,(stu *)local_1a8);
        bVar2 = false;
      }
      std::queue<stu,_std::deque<stu,_std::allocator<stu>_>_>::pop(&this->students);
      std::queue<stu,_std::deque<stu,_std::allocator<stu>_>_>::push
                (&this->students,(value_type *)local_1a8);
      stu::~stu((stu *)local_1a8);
    }
  }
  if (bVar2) {
    poVar4 = std::operator<<((ostream *)&std::cout,"Sorry but the student you search is not exist");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::operator<<((ostream *)&std::cout,"Any key to continue");
    system("pause");
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cout,"------------------Record-------------------");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<((ostream *)&std::cout,"name: ");
    poVar4 = std::operator<<(poVar4,(string *)local_68);
    poVar4 = std::operator<<(poVar4,"    ID: ");
    poVar4 = std::operator<<(poVar4,(string *)&dis.field_0x18);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<((ostream *)&std::cout,"class1: ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,dis._56_4_);
    poVar4 = std::operator<<(poVar4,"   class2: ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,dis._60_4_);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<((ostream *)&std::cout,"ranking: ");
    std::ostream::operator<<(poVar4,dis.class1);
    poVar4 = std::operator<<((ostream *)&std::cout,"-------------------End---------------------");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::operator<<((ostream *)&std::cout,"Any key to continue");
    system("pause");
  }
LAB_00107702:
  std::__cxx11::string::~string((string *)&flag);
  stu::~stu((stu *)local_68);
  return;
}

Assistant:

void student::findRecord(){
    //savedTag("findRecord");
    cout<<"----------------Find Record--------------------"<<endl;
    if(student::students.empty()){
        cout<<"Sorry but there is empty"<<endl;
        cout<<"Any key to continue";
        system("pause");
        return;
    }
    char is;
    cout<<"Your want to search with(name->N, ID->I, ranking->R): ";
    cin >> is; cout<<endl;
    stu dis;            
    string word;
    int num; int flag =1;
    switch(is){
        case 'N':
            cout<<"Your want to search: ";
            cin>>word;
            for(size_t i=0;i < student::students.size();i++){
                stu temp = student::students.front();
                if(temp.name==word){
                    dis = temp;
                    flag = 0;
                }
                student::students.pop();
                student::students.push(temp);
            }
            break;
        case 'I':
            cout<<"Your want to search: ";
            cin>>word;
            for(size_t i=0;i < student::students.size();i++){
                stu temp = student::students.front();
                if(temp.ID==word){
                    dis = temp;
                    flag = 0;
                }
                student::students.pop();
                student::students.push(temp);
            }
            break;
        case 'R':
            cout<<"Your want to search: ";
            cin>>num;
            for(size_t i=0;i<student::students.size();i++){
                stu temp = student::students.front();
                if(temp.ranking==num){
                    dis = temp;
                    flag = 0;
                }
                student::students.pop();
                student::students.push(temp);
            }
            break;
        default:
            cout<<"Error"<<endl;
            return;
    }
    if(flag){
        cout<<"Sorry but the student you search is not exist"<<endl;
        cout<<"Any key to continue";
        system("pause");
        return;
    }
    cout<<"------------------Record-------------------"<<endl;
    cout<<"name: "<<dis.name<<"    ID: "<<dis.ID<<endl;
    cout<<"class1: "<<dis.class1<<"   class2: "<<dis.class2<<endl;
    cout<<"ranking: "<<dis.ranking;
    cout<<"-------------------End---------------------"<<endl;
    cout<<"Any key to continue";
    system("pause");
    return;
}